

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O2

void * crn_compress(crn_comp_params *comp_params,crn_mipmap_params *mip_params,
                   crn_uint32 *compressed_size,crn_uint32 *pActual_quality_level,
                   float *pActual_bitrate)

{
  bool bVar1;
  uchar *puVar2;
  vector<unsigned_char> crn_file_data;
  vector<unsigned_char> local_38;
  
  *compressed_size = 0;
  if (pActual_quality_level != (crn_uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  if (pActual_bitrate != (float *)0x0) {
    *pActual_bitrate = 0.0;
  }
  bVar1 = crn_comp_params::check(comp_params);
  if (bVar1) {
    local_38.m_p = (uchar *)0x0;
    local_38.m_size = 0;
    local_38.m_capacity = 0;
    bVar1 = crnlib::create_compressed_texture
                      (comp_params,mip_params,&local_38,pActual_quality_level,pActual_bitrate);
    puVar2 = local_38.m_p;
    if (bVar1) {
      *compressed_size = local_38.m_size;
      local_38.m_p = (uchar *)0x0;
      local_38.m_size = 0;
      local_38.m_capacity = 0;
    }
    else {
      puVar2 = (uchar *)0x0;
    }
    crnlib::vector<unsigned_char>::~vector(&local_38);
  }
  else {
    puVar2 = (uchar *)0x0;
  }
  return puVar2;
}

Assistant:

void* crn_compress(const crn_comp_params& comp_params, const crn_mipmap_params& mip_params, crn_uint32& compressed_size, crn_uint32* pActual_quality_level, float* pActual_bitrate) {
  compressed_size = 0;
  if (pActual_quality_level)
    *pActual_quality_level = 0;
  if (pActual_bitrate)
    *pActual_bitrate = 0.0f;

  if ((!comp_params.check()) || (!mip_params.check()))
    return NULL;

  crnlib::vector<uint8> crn_file_data;
  if (!create_compressed_texture(comp_params, mip_params, crn_file_data, pActual_quality_level, pActual_bitrate))
    return NULL;

  compressed_size = crn_file_data.size();
  return crn_file_data.assume_ownership();
}